

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

bool __thiscall HEkk::lpFactorRowCompatible(HEkk *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->lp_).num_row_;
  uVar2 = (this->simplex_nla_).factor_.num_row;
  if (uVar2 != uVar1) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                "HEkk::initialiseSimplexLpBasisAndFactor: LP(%6d, %6d) has factor_num_row = %d\n",
                (ulong)(uint)(this->lp_).num_col_,(ulong)uVar1,(ulong)uVar2);
  }
  return uVar2 == uVar1;
}

Assistant:

bool HEkk::lpFactorRowCompatible() const {
  return lpFactorRowCompatible(this->lp_.num_row_);
}